

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O0

void __thiscall soplex::SPxBasisBase<double>::removedCol(SPxBasisBase<double> *this,int i)

{
  bool bVar1;
  Representation RVar2;
  SPxStatus SVar3;
  int iVar4;
  DataKey *pDVar5;
  SPxSolverBase<double> *this_00;
  SVectorBase<double> *pSVar6;
  SVectorBase<double> **ppSVar7;
  Status *pSVar8;
  SPxBasisBase<double> *in_RDI;
  SPxId id;
  int j;
  SPxColId *in_stack_ffffffffffffff88;
  int iVar9;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  Status SVar10;
  undefined8 in_stack_ffffffffffffff98;
  SPxBasisBase<double> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar11;
  undefined7 in_stack_ffffffffffffffc0;
  byte in_stack_ffffffffffffffc7;
  SPxColId local_20;
  DataKey local_18;
  int local_10;
  
  SVar3 = (SPxStatus)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  RVar2 = SPxSolverBase<double>::rep(in_RDI->theLP);
  iVar9 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (RVar2 == COLUMN) {
    Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),iVar9);
    bVar1 = SPxSolverBase<double>::isBasic
                      ((SPxSolverBase<double> *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (Status)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    if (bVar1) {
      setStatus(in_stack_ffffffffffffffa0,SVar3);
    }
  }
  else {
    in_RDI->factorized = false;
    Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),iVar9);
    bVar1 = SPxSolverBase<double>::isBasic
                      ((SPxSolverBase<double> *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (Status)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    if (bVar1) {
      SVar3 = status(in_RDI);
      if (NO_PROBLEM < SVar3) {
        for (local_10 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x271cc0); -1 < local_10
            ; local_10 = local_10 + -1) {
          pDVar5 = &baseId((SPxBasisBase<double> *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           (int)((ulong)in_stack_ffffffffffffff88 >> 0x20))->super_DataKey;
          local_18 = *pDVar5;
          bVar1 = SPxId::isSPxColId((SPxId *)&local_18);
          in_stack_ffffffffffffffc7 = 0;
          if (bVar1) {
            SPxColId::SPxColId(&local_20,(SPxId *)&local_18);
            bVar1 = SPxLPBase<double>::has
                              ((SPxLPBase<double> *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                               in_stack_ffffffffffffff88);
            in_stack_ffffffffffffffc7 = bVar1 ^ 0xff;
          }
          if ((in_stack_ffffffffffffffc7 & 1) != 0) {
            SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x271d4b);
            iVar9 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
            this_00 = (SPxSolverBase<double> *)
                      baseId((SPxBasisBase<double> *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),iVar9);
            pDVar5 = &baseId((SPxBasisBase<double> *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),iVar9)->
                      super_DataKey;
            *pDVar5 = (DataKey)(this_00->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                               super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                               _vptr_ClassArray;
            if (((in_RDI->matrixIsSetup & 1U) != 0) &&
               (iVar11 = local_10,
               iVar4 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x271d99), iVar11 < iVar4
               )) {
              baseId((SPxBasisBase<double> *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),iVar9);
              pSVar6 = SPxSolverBase<double>::vector
                                 (this_00,(SPxId *)CONCAT44(iVar11,in_stack_ffffffffffffffa8));
              ppSVar7 = DataArray<const_soplex::SVectorBase<double>_*>::operator[]
                                  (&in_RDI->matrix,local_10);
              *ppSVar7 = pSVar6;
            }
            break;
          }
        }
      }
    }
    else {
      setStatus(in_stack_ffffffffffffffa0,SVar3);
    }
  }
  iVar9 = (int)((ulong)&in_RDI->thedesc >> 0x20);
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x271e1c);
  pSVar8 = Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           iVar9);
  SVar10 = *pSVar8;
  pSVar8 = Desc::colStatus((Desc *)CONCAT44(SVar10,in_stack_ffffffffffffff90),iVar9);
  *pSVar8 = SVar10;
  reDim((SPxBasisBase<double> *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  return;
}

Assistant:

void SPxBasisBase<R>::removedCol(int i)
{
   assert(status() > NO_PROBLEM);
   assert(theLP != nullptr);

   if(theLP->rep() == SPxSolverBase<R>::COLUMN)
   {
      if(theLP->isBasic(thedesc.colStatus(i)))
         setStatus(NO_PROBLEM);
   }
   else
   {
      assert(theLP->rep() == SPxSolverBase<R>::ROW);
      factorized = false;

      if(!theLP->isBasic(thedesc.colStatus(i)))
         setStatus(NO_PROBLEM);
      else if(status() > NO_PROBLEM)
      {
         for(int j = theLP->dim(); j >= 0; --j)
         {
            SPxId id = baseId(j);

            if(id.isSPxColId() && !theLP->has(SPxColId(id)))
            {
               baseId(j) = baseId(theLP->dim());

               if(matrixIsSetup &&
                     j < theLP->dim())
                  matrix[j] = &theLP->vector(baseId(j));

               break;
            }
         }
      }
   }

   thedesc.colStatus(i) = thedesc.colStatus(theLP->nCols());
   reDim();
}